

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# redis.c
# Opt level: O0

int redis_kv_create_request(application_protocol *proto,request *req)

{
  long *plVar1;
  undefined8 *puVar2;
  size_t sVar3;
  size_t sVar4;
  long *in_FS_OFFSET;
  double dVar5;
  iovec *key;
  int key_idx;
  long val_len;
  kv_info *info;
  request *req_local;
  application_protocol *proto_local;
  
  plVar1 = (long *)proto->arg;
  dVar5 = generate((rand_gen *)plVar1[2]);
  puVar2 = (undefined8 *)(*(long *)(*plVar1 + 0x18) + (long)(int)dVar5 * 0x10);
  if (puVar2 == (undefined8 *)0x0) {
    __assert_fail("key != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/redis.c"
                  ,0xa1,
                  "int redis_kv_create_request(struct application_protocol *, struct request *)");
  }
  sprintf((char *)(*in_FS_OFFSET + -0xf0),"%ld",puVar2[1]);
  req->iovs[1].iov_base = (void *)(*in_FS_OFFSET + -0xf0);
  sVar3 = strlen((char *)(*in_FS_OFFSET + -0xf0));
  req->iovs[1].iov_len = sVar3;
  req->iovs[2].iov_base = ln;
  req->iovs[2].iov_len = 2;
  req->iovs[3].iov_base = (void *)*puVar2;
  req->iovs[3].iov_len = puVar2[1];
  req->iovs[4].iov_base = ln;
  req->iovs[4].iov_len = 2;
  dVar5 = drand48();
  if (dVar5 < (double)plVar1[3] || dVar5 == (double)plVar1[3]) {
    req->iovs[0].iov_base = get_prem;
    req->iovs[0].iov_len = 0xe;
    req->iov_cnt = 5;
  }
  else {
    dVar5 = generate((rand_gen *)plVar1[1]);
    sVar4 = lround(dVar5);
    if (0x200000 < (long)sVar4) {
      __assert_fail("val_len <= MAX_VAL_SIZE",
                    "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/redis.c"
                    ,0xb0,
                    "int redis_kv_create_request(struct application_protocol *, struct request *)");
    }
    req->iovs[0].iov_base = set_prem;
    req->iovs[0].iov_len = 0xe;
    req->iovs[5].iov_base = dollar;
    req->iovs[5].iov_len = 1;
    sprintf((char *)(*in_FS_OFFSET + -0xb0),"%ld",sVar4);
    req->iovs[6].iov_base = (void *)(*in_FS_OFFSET + -0xb0);
    sVar3 = strlen((char *)(*in_FS_OFFSET + -0xb0));
    req->iovs[6].iov_len = sVar3;
    req->iovs[7].iov_base = ln;
    req->iovs[7].iov_len = 2;
    req->iovs[8].iov_base = random_char;
    req->iovs[8].iov_len = sVar4;
    req->iovs[9].iov_base = ln;
    req->iovs[9].iov_len = 2;
    req->iov_cnt = 10;
  }
  return 0;
}

Assistant:

static int redis_kv_create_request(struct application_protocol *proto,
						 struct request *req)
{
	struct kv_info *info;
	long val_len;
	int key_idx;
	struct iovec *key;

	info = (struct kv_info *)proto->arg;
	key_idx = generate(info->key_sel);
	key = &info->key->keys[key_idx];

	assert(key != NULL);

	// Fix key
	sprintf(key_len_str, "%ld", key->iov_len);
	req->iovs[1].iov_base = key_len_str;
	req->iovs[1].iov_len = strlen(key_len_str);
	req->iovs[2].iov_base = ln;
	req->iovs[2].iov_len = 2;
	req->iovs[3].iov_base = key->iov_base;
	req->iovs[3].iov_len = key->iov_len;
	req->iovs[4].iov_base = ln;
	req->iovs[4].iov_len = 2;

	if (drand48() > info->get_ratio) {
		val_len = lround(generate(info->val_len));
		assert(val_len <= MAX_VAL_SIZE);

		req->iovs[0].iov_base = set_prem;
		req->iovs[0].iov_len = 14;

		req->iovs[5].iov_base = dollar;
		req->iovs[5].iov_len = 1;

		// Fix val
		sprintf(val_len_str, "%ld", val_len);
		req->iovs[6].iov_base = val_len_str;
		req->iovs[6].iov_len = strlen(val_len_str);
		req->iovs[7].iov_base = ln;
		req->iovs[7].iov_len = 2;
		req->iovs[8].iov_base = random_char;
		req->iovs[8].iov_len = val_len;
		req->iovs[9].iov_base = ln;
		req->iovs[9].iov_len = 2;

		req->iov_cnt = 10;
#ifdef ENABLE_R2P2
		req->meta = (void *)(unsigned long)FIXED_ROUTE;
#endif
	} else {
		req->iovs[0].iov_base = get_prem;
		req->iovs[0].iov_len = 14;

		req->iov_cnt = 5;
#ifdef ENABLE_R2P2
		req->meta = (void *)(unsigned long)LB_ROUTE;
#endif
	}

	return 0;
}